

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramBinaryCase::verifyProgramBinary
          (ProgramBinaryCase *this,ProgramBinary *binary)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  bool bVar2;
  MessageBuilder *this_01;
  undefined1 local_1a0 [384];
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar2 = isFormatSupported(this,binary->format);
  if (!bVar2) {
    this_00 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = pTVar1;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Program binary format ");
    this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&binary->format);
    std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " is not among the supported formats reported by the platform.");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid format");
  }
  return;
}

Assistant:

void ProgramBinaryCase::verifyProgramBinary (ProgramBinary& binary)
{
	TestLog& log = m_testCtx.getLog();

	if (!isFormatSupported(binary.format))
	{
		log << TestLog::Message << "Program binary format " << binary.format << " is not among the supported formats reported by the platform." << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid format");
	}
}